

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-visuals.c
# Opt level: O3

parser * visuals_file_parser_init(void)

{
  undefined8 *p;
  void *pvVar1;
  parser *p_00;
  
  p = (undefined8 *)mem_zalloc(0x50);
  if (p != (undefined8 *)0x0) {
    p[3] = 0x201;
    pvVar1 = mem_zalloc(0x1008);
    p[2] = pvVar1;
    if (pvVar1 != (void *)0x0) {
      p[7] = 8;
      pvVar1 = mem_zalloc(0x40);
      p[6] = pvVar1;
      if (pvVar1 != (void *)0x0) {
        p[9] = p[7] << 6;
        pvVar1 = mem_zalloc(p[7] << 9);
        p[8] = pvVar1;
        if (pvVar1 != (void *)0x0) {
          *p = 0;
          p[1] = 0;
          p[4] = 0;
          p[5] = 0;
          goto LAB_0020d910;
        }
        mem_free((void *)p[6]);
      }
      mem_free((void *)p[2]);
    }
    mem_free(p);
  }
  p = (undefined8 *)0x0;
LAB_0020d910:
  p_00 = parser_new();
  if (p_00 == (parser *)0x0 || p == (undefined8 *)0x0) {
    p_00 = (parser *)0x0;
  }
  else {
    parser_setpriv(p_00,p);
    parser_reg(p_00,"flicker sym color str name",visuals_parse_flicker);
    parser_reg(p_00,"flicker-color sym color",visuals_parse_flicker_color);
    parser_reg(p_00,"cycle sym group sym name",visuals_parse_cycle);
    parser_reg(p_00,"cycle-color sym color",visuals_parse_cycle_color);
  }
  return p_00;
}

Assistant:

static struct visuals_parse_context *visuals_parse_context_new(void)
{
	struct visuals_parse_context *context = mem_zalloc(sizeof(*context));

	if (context == NULL) {
		return NULL;
	}

	/* Add some extra capacity, since this array will start at 1 instead of 0. */
	context->max_cycles = VISUALS_GROUPS_MAX * VISUALS_CYCLES_MAX + 1;
	context->cycles = mem_zalloc(context->max_cycles * sizeof(*(context->cycles)));

	if (context->cycles == NULL) {
		mem_free(context);
		return NULL;
	}

	context->max_groups = VISUALS_GROUPS_MAX;
	context->group_names = mem_zalloc(context->max_groups * sizeof(*(context->group_names)));

	if (context->group_names == NULL) {
		mem_free(context->cycles);
		mem_free(context);
		return NULL;
	}

	context->max_group_cycles = context->max_groups * VISUALS_CYCLES_MAX;
	context->group_cycles = mem_zalloc(context->max_group_cycles * sizeof(*(context->group_cycles)));

	if (context->group_cycles == NULL) {
		mem_free(context->group_names);
		mem_free(context->cycles);
		mem_free(context);
		return NULL;
	}

	context->cycles_index = 0;
	context->cycle_step_index = 0;
	context->flicker_color_index = 0;
	context->flicker_cycle_index = 0;
	return context;
}